

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QRect>_>::Data
          (Data<QHashPrivate::Node<QWidget_*,_QRect>_> *this,
          Data<QHashPrivate::Node<QWidget_*,_QRect>_> *other)

{
  Entry *pEVar1;
  Span *pSVar2;
  Entry *pEVar3;
  undefined8 uVar4;
  ulong uVar5;
  Node<QWidget_*,_QRect> *pNVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  R RVar10;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar8 = other->numBuckets;
  sVar9 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar9;
  this->spans = (Span *)0x0;
  RVar10 = allocateSpans(sVar8);
  this->spans = (Span *)RVar10.spans;
  if (RVar10.nSpans != 0) {
    lVar7 = 0;
    sVar8 = 0;
    do {
      pSVar2 = other->spans;
      sVar9 = 0;
      do {
        uVar5 = (ulong)pSVar2->offsets[sVar9 + lVar7];
        if (uVar5 != 0xff) {
          pEVar3 = pSVar2[sVar8].entries;
          pNVar6 = Span<QHashPrivate::Node<QWidget_*,_QRect>_>::insert(this->spans + sVar8,sVar9);
          pEVar1 = pEVar3 + uVar5;
          uVar4 = *(undefined8 *)((pEVar1->storage).data + 8);
          pNVar6->key = *(QWidget **)(pEVar1->storage).data;
          (pNVar6->value).x1 = (Representation)(int)uVar4;
          (pNVar6->value).y1 = (Representation)(int)((ulong)uVar4 >> 0x20);
          uVar4 = *(undefined8 *)(pEVar3[uVar5].storage.data + 0x10);
          (pNVar6->value).x2 = (Representation)(int)uVar4;
          (pNVar6->value).y2 = (Representation)(int)((ulong)uVar4 >> 0x20);
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 != 0x80);
      sVar8 = sVar8 + 1;
      lVar7 = lVar7 + 0x90;
    } while (sVar8 != RVar10.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }